

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_parse.c
# Opt level: O0

void ParseUsbPortBlock(USBPortBlock_t *dblock)

{
  int local_7c;
  int i;
  char *flags [6];
  char *generations [6];
  USBPortBlock_t *dblock_local;
  
  memcpy(flags + 5,&PTR_anon_var_dwarf_456_00108d40,0x30);
  memcpy(&stack0xffffffffffffff88,&PTR_anon_var_dwarf_eff_00108d70,0x30);
  printf("   COM-HPC USB Port block:\n");
  printf("      Port %d: Generation: %s\n",(ulong)dblock->PortNr,
         flags[(long)(int)(dblock->UsbGeneration & 7) + 5]);
  if (((int)(uint)dblock->UsbGeneration >> 4 & 7U) != 0) {
    printf("      Paired with port %d\n",(ulong)((int)(uint)dblock->UsbGeneration >> 4 & 7));
  }
  printf("      Supported features: ");
  for (local_7c = 0; local_7c < 6; local_7c = local_7c + 1) {
    if (((uint)dblock->Flags & 1 << ((byte)local_7c & 0x1f)) != 0) {
      printf("%s ",*(undefined8 *)(&stack0xffffffffffffff88 + (long)local_7c * 8));
    }
  }
  printf("\n");
  return;
}

Assistant:

void ParseUsbPortBlock(USBPortBlock_t *dblock)
{
    const char *generations[] =
        { "USB 2.0", "USB 3.2 Gen 1", "USB 3.2 Gen 2", "USB 3.2 Gen 2x2", "USB 4.0 Gen 2x2", "USB 4.0 Gen 3x2" };
    const char *flags[] =
        { "DisplayPort", "PCIe", "USB-C-Connector", "USB-C-LaneMuxing", "Port80", "ClientMode" };
	printf("   COM-HPC USB Port block:\n");
	printf("      Port %d: Generation: %s\n", dblock->PortNr, generations[dblock->UsbGeneration & 7] );
    if((dblock->UsbGeneration >> 4) & 7) {
        printf("      Paired with port %d\n", (dblock->UsbGeneration >> 4) & 7);
    }
    printf("      Supported features: ");
    for(int i = 0; i < 6; i++) {
        if(dblock->Flags & (1 << i)) {
            printf("%s ", flags[i]);
        }
    }
    printf("\n");
}